

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O0

StringU16 * Jinx::Impl::ConvertUtf8ToUtf16(StringU16 *__return_storage_ptr__,String *utf8Str)

{
  char32_t utf32CodePoint_00;
  size_type sVar1;
  size_t outBufferCount;
  size_t local_50;
  size_t numOut;
  char32_t utf32CodePoint;
  char16_t outBuffer [3];
  int local_28;
  char *cInStrEnd;
  char *cInStr;
  String *utf8Str_local;
  StringU16 *outString;
  
  cInStrEnd = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
              c_str(utf8Str);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    (utf8Str);
  local_28 = (int)cInStrEnd + (int)sVar1;
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::
  basic_string(__return_storage_ptr__);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                    (utf8Str);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::
  reserve(__return_storage_ptr__,sVar1);
  while (*cInStrEnd != '\0') {
    ConvertUtf8ToUtf32(cInStrEnd,(ulong)(uint)(local_28 - (int)cInStrEnd),(char32_t *)&numOut,
                       &local_50);
    utf32CodePoint_00 = (char32_t)numOut;
    cInStrEnd = cInStrEnd + local_50;
    outBufferCount = std::size<char16_t,3ul>((char16_t (*) [3])((long)&numOut + 6));
    ConvertUtf32ToUtf16(utf32CodePoint_00,(char16_t *)((long)&numOut + 6),outBufferCount,&local_50);
    *(undefined2 *)((long)&numOut + local_50 * 2 + 6) = 0;
    std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_Jinx::Allocator<char16_t>_>::
    operator+=(__return_storage_ptr__,(char16_t *)((long)&numOut + 6));
  }
  return __return_storage_ptr__;
}

Assistant:

inline_t StringU16 ConvertUtf8ToUtf16(const String & utf8Str)
	{
		const char * cInStr = utf8Str.c_str();
		const char * cInStrEnd = cInStr + utf8Str.size();
		StringU16 outString;
		outString.reserve(utf8Str.size());
		char16_t outBuffer[3];
		char32_t utf32CodePoint;
		size_t numOut;
		while (*cInStr != 0)
		{
			Impl::ConvertUtf8ToUtf32(cInStr, (uint32_t)(cInStrEnd - cInStr), &utf32CodePoint, &numOut);
			cInStr += numOut;
			Impl::ConvertUtf32ToUtf16(utf32CodePoint, outBuffer, std::size(outBuffer), &numOut);
			outBuffer[numOut] = 0;
			outString += outBuffer;
		}
		return outString;
	}